

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O2

ma_result ma_bpf_reinit__internal(ma_bpf_config *pConfig,void *pHeap,ma_bpf *pBPF,ma_bool32 isNew)

{
  ma_format mVar1;
  uint uVar2;
  ma_uint32 mVar3;
  ma_result mVar4;
  ma_result mVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  ma_bpf_heap_layout heapLayout;
  size_t bpf2HeapSizeInBytes;
  ma_bpf2_config local_50;
  
  mVar4 = MA_INVALID_ARGS;
  mVar5 = mVar4;
  if (((pConfig != (ma_bpf_config *)0x0 && pBPF != (ma_bpf *)0x0) &&
      (((mVar1 = pConfig->format, mVar1 == ma_format_f32 || (mVar1 == ma_format_s16)) &&
       (mVar5 = MA_INVALID_OPERATION, pBPF->format == ma_format_unknown || pBPF->format == mVar1))))
     && ((pBPF->channels == 0 || (pBPF->channels == pConfig->channels)))) {
    uVar2 = pConfig->order;
    mVar5 = mVar4;
    if ((uVar2 & 1) == 0 && (ulong)uVar2 < 9) {
      uVar6 = uVar2 >> 1;
      if (isNew == 0) {
        if (pBPF->bpf2Count != uVar6) {
          return MA_INVALID_OPERATION;
        }
        heapLayout.sizeInBytes = 0;
        heapLayout.bpf2Offset = 0;
      }
      else {
        mVar4 = ma_bpf_get_heap_layout(pConfig,&heapLayout);
        if (mVar4 != MA_SUCCESS) {
          return mVar4;
        }
        pBPF->_pHeap = pHeap;
        if (heapLayout.sizeInBytes != 0) {
          memset(pHeap,0,heapLayout.sizeInBytes);
        }
        pBPF->pBPF2 = (ma_bpf2 *)(heapLayout.bpf2Offset + (long)pHeap);
      }
      lVar7 = 0;
      uVar8 = 0;
      do {
        if (uVar6 == uVar8) {
          pBPF->bpf2Count = uVar6;
          mVar3 = pConfig->channels;
          pBPF->format = pConfig->format;
          pBPF->channels = mVar3;
          return MA_SUCCESS;
        }
        local_50._8_8_ = ZEXT48(pConfig->sampleRate);
        local_50.cutoffFrequency = pConfig->cutoffFrequency;
        local_50.format = pConfig->format;
        local_50.channels = pConfig->channels;
        local_50.q = 0.707107;
        if (isNew == 0) {
          mVar5 = ma_bpf2_reinit(&local_50,(ma_bpf2 *)((long)&(pBPF->pBPF2->bq).format + lVar7));
        }
        else {
          mVar5 = ma_bpf2_get_heap_size(&local_50,&bpf2HeapSizeInBytes);
          if (mVar5 == MA_SUCCESS) {
            mVar5 = ma_bpf2_init_preallocated
                              (&local_50,
                               (void *)((long)pHeap +
                                       bpf2HeapSizeInBytes * uVar8 +
                                       heapLayout.bpf2Offset + (ulong)uVar2 * 0x20),
                               (ma_bpf2 *)((long)&(pBPF->pBPF2->bq).format + lVar7));
          }
        }
        uVar8 = uVar8 + 1;
        lVar7 = lVar7 + 0x40;
      } while (mVar5 == MA_SUCCESS);
    }
  }
  return mVar5;
}

Assistant:

static ma_result ma_bpf_reinit__internal(const ma_bpf_config* pConfig, void* pHeap, ma_bpf* pBPF, ma_bool32 isNew)
{
    ma_result result;
    ma_uint32 bpf2Count;
    ma_uint32 ibpf2;
    ma_bpf_heap_layout heapLayout;  /* Only used if isNew is true. */

    if (pBPF == NULL || pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    /* Only supporting f32 and s16. */
    if (pConfig->format != ma_format_f32 && pConfig->format != ma_format_s16) {
        return MA_INVALID_ARGS;
    }

    /* The format cannot be changed after initialization. */
    if (pBPF->format != ma_format_unknown && pBPF->format != pConfig->format) {
        return MA_INVALID_OPERATION;
    }

    /* The channel count cannot be changed after initialization. */
    if (pBPF->channels != 0 && pBPF->channels != pConfig->channels) {
        return MA_INVALID_OPERATION;
    }

    if (pConfig->order > MA_MAX_FILTER_ORDER) {
        return MA_INVALID_ARGS;
    }

    /* We must have an even number of order. */
    if ((pConfig->order & 0x1) != 0) {
        return MA_INVALID_ARGS;
    }

    bpf2Count = pConfig->order / 2;

    /* The filter order can't change between reinits. */
    if (!isNew) {
        if (pBPF->bpf2Count != bpf2Count) {
            return MA_INVALID_OPERATION;
        }
    }

    if (isNew) {
        result = ma_bpf_get_heap_layout(pConfig, &heapLayout);
        if (result != MA_SUCCESS) {
            return result;
        }

        pBPF->_pHeap = pHeap;
        MA_ZERO_MEMORY(pHeap, heapLayout.sizeInBytes);

        pBPF->pBPF2 = (ma_bpf2*)ma_offset_ptr(pHeap, heapLayout.bpf2Offset);
    } else {
        MA_ZERO_OBJECT(&heapLayout);
    }

    for (ibpf2 = 0; ibpf2 < bpf2Count; ibpf2 += 1) {
        ma_bpf2_config bpf2Config;
        double q;

        /* TODO: Calculate Q to make this a proper Butterworth filter. */
        q = 0.707107;

        bpf2Config = ma_bpf2_config_init(pConfig->format, pConfig->channels, pConfig->sampleRate, pConfig->cutoffFrequency, q);

        if (isNew) {
            size_t bpf2HeapSizeInBytes;

            result = ma_bpf2_get_heap_size(&bpf2Config, &bpf2HeapSizeInBytes);
            if (result == MA_SUCCESS) {
                result = ma_bpf2_init_preallocated(&bpf2Config, ma_offset_ptr(pHeap, heapLayout.bpf2Offset + (sizeof(ma_bpf2) * bpf2Count) + (ibpf2 * bpf2HeapSizeInBytes)), &pBPF->pBPF2[ibpf2]);
            }
        } else {
            result = ma_bpf2_reinit(&bpf2Config, &pBPF->pBPF2[ibpf2]);
        }

        if (result != MA_SUCCESS) {
            return result;
        }
    }

    pBPF->bpf2Count = bpf2Count;
    pBPF->format    = pConfig->format;
    pBPF->channels  = pConfig->channels;

    return MA_SUCCESS;
}